

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  Deconvolution *pDVar6;
  Option *pOVar7;
  Mat *pMVar8;
  long in_RSI;
  long in_RDI;
  double dVar9;
  int i_5;
  int size_3;
  float *outptr_4;
  int i_4;
  float max;
  float min;
  int size_2;
  float *outptr_3;
  int i_3;
  float slope;
  int size_1;
  float *outptr_2;
  int i_2;
  int size;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  Mat m;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffd60;
  Mat *in_stack_fffffffffffffd68;
  Mat *in_stack_fffffffffffffd70;
  Option *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  float in_stack_fffffffffffffd84;
  Mat *in_stack_fffffffffffffd88;
  Deconvolution *in_stack_fffffffffffffd90;
  float local_23c;
  int local_210;
  int local_200;
  int local_1e4;
  float local_1cc;
  int local_1c8;
  int local_1c4;
  float *local_1c0;
  float local_1b4;
  int local_1b0;
  float local_1ac;
  Mat local_1a8;
  int local_15c;
  float *local_158;
  float *local_150;
  int local_144;
  int local_140;
  float local_13c;
  Mat local_138;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  reference local_d8;
  vector<int,_std::allocator<int>_> local_c8;
  int local_ac;
  undefined4 local_a8;
  Mat local_98;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_48 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_4c = (local_2c + -1) * *(int *)(in_RDI + 0xe4) + local_44 + *(int *)(in_RDI + 0xfc);
  local_50 = (local_30 + -1) * *(int *)(in_RDI + 0xe8) + local_48 + *(int *)(in_RDI + 0x100);
  Mat::Mat(&local_98);
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) &&
     ((*(int *)(in_RDI + 0xf8) < 1 &&
      ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
    Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78,
                (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),(size_t)in_stack_fffffffffffffd68,
                (Allocator *)in_stack_fffffffffffffd60);
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78,
                (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),(size_t)in_stack_fffffffffffffd68,
                (Allocator *)in_stack_fffffffffffffd60);
  }
  bVar3 = Mat::empty(in_stack_fffffffffffffd60);
  if (bVar3) {
    local_4 = -100;
    local_a8 = 1;
  }
  else {
    local_ac = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    std::allocator<int>::allocator((allocator<int> *)0x3874c6);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (size_type)in_stack_fffffffffffffd78,(allocator_type *)in_stack_fffffffffffffd70);
    std::allocator<int>::~allocator((allocator<int> *)0x3874ef);
    local_d8 = std::vector<int,_std::allocator<int>_>::operator[](&local_c8,0);
    local_dc = 0;
    local_e0 = 0;
    local_e4 = local_4c * *(int *)(in_RDI + 0xe0) -
               *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xdc);
    for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0xd8); local_e8 = local_e8 + 1) {
      for (local_ec = 0; local_ec < *(int *)(in_RDI + 0xd4); local_ec = local_ec + 1) {
        local_d8[local_dc] = local_e0;
        local_dc = local_dc + 1;
        local_e0 = *(int *)(in_RDI + 0xdc) + local_e0;
      }
      local_e0 = local_e4 + local_e0;
    }
    for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0xd0); local_f0 = local_f0 + 1) {
      Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
      if (*(int *)(in_RDI + 0x10c) == 0) {
        local_23c = 0.0;
      }
      else {
        pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x1a8),(long)local_f0);
        local_23c = *pfVar5;
      }
      local_13c = local_23c;
      Mat::fill(in_stack_fffffffffffffd70,(float)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      for (local_140 = 0; local_140 < local_30; local_140 = local_140 + 1) {
        for (local_144 = 0; local_144 < local_2c; local_144 = local_144 + 1) {
          local_150 = Mat::row(&local_138,local_140 * *(int *)(in_RDI + 0xe8));
          local_150 = local_150 + local_144 * *(int *)(in_RDI + 0xe4);
          local_158 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x160));
          local_158 = local_158 + local_ac * local_34 * local_f0;
          for (local_15c = 0; local_15c < local_34; local_15c = local_15c + 1) {
            Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
            pfVar5 = Mat::row(&local_1a8,local_140);
            local_1ac = pfVar5[local_144];
            for (local_1b0 = 0; local_1b0 < local_ac; local_1b0 = local_1b0 + 1) {
              local_1b4 = local_158[local_1b0];
              local_150[local_d8[local_1b0]] =
                   local_1ac * local_1b4 + local_150[local_d8[local_1b0]];
            }
            local_158 = local_158 + local_ac;
            Mat::~Mat((Mat *)0x387954);
          }
        }
      }
      if (*(int *)(in_RDI + 0x114) == 1) {
        local_1c0 = Mat::operator_cast_to_float_(&local_138);
        local_1c4 = local_4c * local_50;
        for (local_1c8 = 0; local_1c8 < local_1c4; local_1c8 = local_1c8 + 1) {
          local_1cc = 0.0;
          pfVar5 = std::max<float>(local_1c0 + local_1c8,&local_1cc);
          local_1c0[local_1c8] = *pfVar5;
        }
      }
      else if (*(int *)(in_RDI + 0x114) == 2) {
        pDVar6 = (Deconvolution *)Mat::operator_cast_to_float_(&local_138);
        iVar4 = local_4c * local_50;
        in_stack_fffffffffffffd90 = pDVar6;
        in_stack_fffffffffffffd88 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x118),0);
        fVar1 = *(float *)&in_stack_fffffffffffffd88->data;
        for (local_1e4 = 0; local_1e4 < iVar4; local_1e4 = local_1e4 + 1) {
          if (*(float *)((long)&(pDVar6->super_Layer)._vptr_Layer + (long)local_1e4 * 4) <= 0.0) {
            in_stack_fffffffffffffd84 =
                 *(float *)((long)&(pDVar6->super_Layer)._vptr_Layer + (long)local_1e4 * 4) * fVar1;
          }
          else {
            in_stack_fffffffffffffd84 =
                 *(float *)((long)&(pDVar6->super_Layer)._vptr_Layer + (long)local_1e4 * 4);
          }
          *(float *)((long)&(pDVar6->super_Layer)._vptr_Layer + (long)local_1e4 * 4) =
               in_stack_fffffffffffffd84;
        }
      }
      else if (*(int *)(in_RDI + 0x114) == 3) {
        pOVar7 = (Option *)Mat::operator_cast_to_float_(&local_138);
        iVar4 = local_4c * local_50;
        in_stack_fffffffffffffd78 = pOVar7;
        in_stack_fffffffffffffd70 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x118),0);
        fVar1 = *(float *)&in_stack_fffffffffffffd70->data;
        in_stack_fffffffffffffd68 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x118),1);
        fVar2 = *(float *)&in_stack_fffffffffffffd68->data;
        for (local_200 = 0; local_200 < iVar4; local_200 = local_200 + 1) {
          if (*(float *)(&pOVar7->lightmode + (long)local_200 * 4) < fVar1) {
            *(float *)(&pOVar7->lightmode + (long)local_200 * 4) = fVar1;
          }
          if (fVar2 < *(float *)(&pOVar7->lightmode + (long)local_200 * 4)) {
            *(float *)(&pOVar7->lightmode + (long)local_200 * 4) = fVar2;
          }
        }
      }
      else if (*(int *)(in_RDI + 0x114) == 4) {
        pMVar8 = (Mat *)Mat::operator_cast_to_float_(&local_138);
        iVar4 = local_4c * local_50;
        in_stack_fffffffffffffd60 = pMVar8;
        for (local_210 = 0; local_210 < iVar4; local_210 = local_210 + 1) {
          dVar9 = std::exp((double)((ulong)(uint)*(float *)((long)&pMVar8->data +
                                                           (long)local_210 * 4) ^ 0x8000000080000000
                                   ));
          *(float *)((long)&pMVar8->data + (long)local_210 * 4) = 1.0 / (SUB84(dVar9,0) + 1.0);
        }
      }
      Mat::~Mat((Mat *)0x387df9);
    }
    cut_padding(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                (Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78);
    bVar3 = Mat::empty(in_stack_fffffffffffffd60);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      local_4 = 0;
    }
    local_a8 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
  }
  Mat::~Mat((Mat *)0x387ebe);
  return local_4;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}